

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O3

TestConfig_conflict *
vkt::memory::anon_unknown_0::subMappedConfig
          (TestConfig_conflict *__return_storage_ptr__,VkDeviceSize allocationSize,
          MemoryRange *mapping,Op op,deUint32 seed)

{
  VkDeviceSize VVar1;
  VkDeviceSize VVar2;
  VkDeviceSize VVar3;
  pointer pMVar4;
  TestConfig_conflict *in_RAX;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  pointer pMVar5;
  pointer pMVar6;
  pointer extraout_RAX_02;
  ulong uVar7;
  MemoryRange *__cur;
  undefined4 uStack_94;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_80;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  vStack_68;
  bool local_50;
  value_type local_48;
  VkDeviceSize local_38;
  VkDeviceSize VStack_30;
  
  vStack_68.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_68.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_68.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  VVar2 = mapping->offset;
  VVar3 = mapping->size;
  local_50 = false;
  if (OP_BUFFER_BINDMEMORY < op) {
    __return_storage_ptr__->allocationSize = 0xffffffffffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).offset = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).offset + 4) = 0xffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).size = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).size + 4) = 0xffffffff;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return in_RAX;
  }
  switch(op) {
  case OP_MAP:
    (__return_storage_ptr__->mapping).offset = VVar2;
    (__return_storage_ptr__->mapping).size = VVar3;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_94,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->remap = false;
    return (TestConfig_conflict *)0x0;
  case OP_FLUSH:
    local_38 = mapping->offset;
    VStack_30 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = local_38;
    pMVar6->size = VStack_30;
    goto LAB_00639518;
  case OP_MAP_FLUSH:
    VVar1 = mapping->offset;
    uVar7 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = (uVar7 >> 2) + VVar1;
    pMVar6->size = uVar7 >> 1;
LAB_00639518:
    if (local_80.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->mapping).offset = VVar2;
    (__return_storage_ptr__->mapping).size = VVar3;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_94,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6 + 1;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6 + 1;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         vStack_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    goto LAB_006397a5;
  case OP_MAP_INVALIDATE:
    uVar7 = mapping->size >> 1;
    local_48.size = mapping->size - uVar7;
    local_48.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    pMVar6 = extraout_RAX_00;
    break;
  case OP_MAP_READ:
    uVar7 = mapping->size;
    local_48.offset = uVar7 / 3 + mapping->offset;
    local_48.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    pMVar6 = extraout_RAX;
    break;
  case OP_INVALIDATE:
    local_38 = mapping->offset;
    VStack_30 = mapping->size;
    pMVar5 = (pointer)operator_new(0x10);
    pMVar6 = local_80.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar5 + 1;
    pMVar5->offset = local_38;
    pMVar5->size = VStack_30;
    pMVar4 = local_80.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_80.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar7 = (long)local_80.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_80.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_80.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar5;
      local_80.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_80.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      operator_delete(pMVar6,uVar7);
      pMVar5 = local_80.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar4 = local_80.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar4;
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar5;
    local_38 = mapping->offset;
    VStack_30 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = local_38;
    pMVar6->size = VStack_30;
    goto LAB_00639658;
  case OP_MAP_MODIFY:
    VVar1 = mapping->offset;
    uVar7 = mapping->size;
    pMVar5 = (pointer)operator_new(0x10);
    pMVar6 = local_80.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar5 + 1;
    pMVar5->offset = (uVar7 >> 2) + VVar1;
    pMVar5->size = uVar7 >> 1;
    pMVar4 = local_80.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_80.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar7 = (long)local_80.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_80.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_80.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar5;
      local_80.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_80.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      operator_delete(pMVar6,uVar7);
      pMVar5 = local_80.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar4 = local_80.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar4;
    local_80.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar5;
    VVar1 = mapping->offset;
    uVar7 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = (uVar7 >> 2) + VVar1;
    pMVar6->size = uVar7 >> 1;
LAB_00639658:
    if (vStack_68.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_68.
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_68.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_68.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->mapping).offset = VVar2;
    (__return_storage_ptr__->mapping).size = VVar3;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_94,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_80.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_80.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_80.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6 + 1;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6 + 1;
    goto LAB_006397a5;
  case OP_BUFFER_CREATE:
    uVar7 = mapping->size >> 1;
    local_48.size = mapping->size - uVar7;
    local_48.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    uVar7 = mapping->size >> 1;
    local_48.size = mapping->size - uVar7;
    local_48.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_68,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_68,&local_48);
    pMVar6 = extraout_RAX_01;
    break;
  case OP_BUFFER_DESTROY:
    uVar7 = mapping->size;
    local_48.offset = uVar7 / 3 + mapping->offset;
    local_48.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_80,&local_48);
    uVar7 = mapping->size;
    local_48.offset = uVar7 / 3 + mapping->offset;
    local_48.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_68,&local_48);
    local_48.offset = mapping->offset;
    local_48.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_68,&local_48);
    pMVar6 = extraout_RAX_02;
    break;
  case OP_BUFFER_BINDMEMORY:
    (__return_storage_ptr__->mapping).offset = VVar2;
    (__return_storage_ptr__->mapping).size = VVar3;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_94,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->remap = true;
    return (TestConfig_conflict *)0x0;
  }
  (__return_storage_ptr__->mapping).offset = VVar2;
  (__return_storage_ptr__->mapping).size = VVar3;
  __return_storage_ptr__->allocationSize = allocationSize;
  *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_94,seed);
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_80.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_80.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_80.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start =
       vStack_68.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       vStack_68.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       vStack_68.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_80.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6;
LAB_006397a5:
  __return_storage_ptr__->remap = local_50;
  return (TestConfig_conflict *)
         CONCAT71((int7)((ulong)local_80.
                                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 8),local_50);
}

Assistant:

TestConfig subMappedConfig (VkDeviceSize				allocationSize,
							const MemoryRange&			mapping,
							Op							op,
							deUint32					seed)
{
	TestConfig config;

	config.allocationSize	= allocationSize;
	config.seed				= seed;
	config.mapping			= mapping;
	config.remap			= false;

	switch (op)
	{
		case OP_NONE:
			return config;

		case OP_REMAP:
			config.remap = true;
			return config;

		case OP_FLUSH:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_FLUSH:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_FLUSH_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_FLUSH_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		case OP_INVALIDATE:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_INVALIDATE:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_INVALIDATE_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_INVALIDATE_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		default:
			DE_FATAL("Unknown Op");
			return TestConfig();
	}
}